

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

Vec_Int_t *
Saig_ManProcessCex(Aig_Man_t *p,int iFirstFlopPi,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vRes;
  int iVar7;
  Aig_Man_t *pAVar8;
  Vec_Int_t *p_00;
  int i;
  
  pvVar3 = Vec_PtrEntry(vSimInfo,1);
  pvVar4 = Vec_PtrEntry(vSimInfo,0);
  uVar2 = pCex->iFrame * 2 + 2;
  if ((long)pvVar3 - (long)pvVar4 >> 2 <
      (long)(int)((((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1e) == 0))) {
    __assert_fail("(unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x18a,
                  "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)");
  }
  iVar1 = Saig_ManSimDataInit2(p,pCex,vSimInfo);
  if (iVar1 != 1) {
    __assert_fail("Value == SAIG_ONE_NEW",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x18d,
                  "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)");
  }
  for (iVar1 = 0; iVar1 < p->nRegs; iVar1 = iVar1 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar1);
    Saig_ManSetAndDriveImplications_rec(p,pAVar5,0,pCex->iFrame,vSimInfo);
  }
  iVar1 = pCex->iFrame;
  iVar7 = 0;
  if (0 < iFirstFlopPi) {
    iVar7 = iFirstFlopPi;
  }
  for (; -1 < iVar1; iVar1 = iVar1 + -1) {
    Saig_ManSetAndDriveImplications_rec(p,p->pConst1,iVar1,pCex->iFrame,vSimInfo);
    for (i = 0; iVar7 != i; i = i + 1) {
      pAVar5 = Aig_ManCi(p,i);
      Saig_ManSetAndDriveImplications_rec(p,pAVar5,iVar1,pCex->iFrame,vSimInfo);
    }
  }
  pAVar5 = Aig_ManCo(p,pCex->iPo);
  pAVar8 = p;
  Saig_ManExplorePaths_rec(p,pAVar5,pCex->iFrame,pCex->iFrame,vSimInfo);
  iVar1 = (int)pAVar8;
  pVVar6 = Vec_IntAlloc(iVar1);
  vRes = Vec_IntAlloc(iVar1);
  do {
    if (p->nTruePis <= iFirstFlopPi) {
      iVar1 = Saig_ManSimDataInit(p,pCex,vSimInfo,vRes);
      if (iVar1 != 2) {
        __assert_fail("Value == SAIG_ONE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                      ,0x1ab,
                      "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)"
                     );
      }
      free(vRes->pArray);
      free(vRes);
      return pVVar6;
    }
    iVar1 = pCex->iFrame;
    do {
      p_00 = vRes;
      if (iVar1 < 0) break;
      pAVar5 = Aig_ManCi(p,iFirstFlopPi);
      uVar2 = Saig_ManSimInfo2Get(vSimInfo,pAVar5,iVar1);
      iVar1 = iVar1 + -1;
      p_00 = pVVar6;
    } while (uVar2 < 2);
    Vec_IntPush(p_00,iFirstFlopPi);
    iFirstFlopPi = iFirstFlopPi + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_ManProcessCex( Aig_Man_t * p, int iFirstFlopPi, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, int fVerbose )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vRes, * vResInv;
    int i, f, Value;
//    assert( Aig_ManRegNum(p) > 0 );
    assert( (unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1)) );
    // start simulation data
    Value = Saig_ManSimDataInit2( p, pCex, vSimInfo );
    assert( Value == SAIG_ONE_NEW );
    // derive implications of constants and primary inputs
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSetAndDriveImplications_rec( p, pObj, 0, pCex->iFrame, vSimInfo );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Saig_ManSetAndDriveImplications_rec( p, Aig_ManConst1(p), f, pCex->iFrame, vSimInfo );
        for ( i = 0; i < iFirstFlopPi; i++ )
            Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, i), f, pCex->iFrame, vSimInfo );
    }
    // recursively compute justification
    Saig_ManExplorePaths_rec( p, Aig_ManCo(p, pCex->iPo), pCex->iFrame, pCex->iFrame, vSimInfo );
    // select the result
    vRes = Vec_IntAlloc( 1000 );
    vResInv = Vec_IntAlloc( 1000 );
    for ( i = iFirstFlopPi; i < Saig_ManPiNum(p); i++ )
    {
        for ( f = pCex->iFrame; f >= 0; f-- )
        {
            Value = Saig_ManSimInfo2Get( vSimInfo, Aig_ManCi(p, i), f );
            if ( Saig_ManSimInfo2IsOld( Value ) )
                break;
        }
        if ( f >= 0 )
            Vec_IntPush( vRes, i );
        else
            Vec_IntPush( vResInv, i );
    }
    // resimulate to make sure it is valid
    Value = Saig_ManSimDataInit( p, pCex, vSimInfo, vResInv );
    assert( Value == SAIG_ONE );
    Vec_IntFree( vResInv );
    return vRes;
}